

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.h
# Opt level: O0

void set_default_wiener(WienerInfo *wiener_info)

{
  WienerInfo *wiener_info_local;
  
  wiener_info->hfilter[0] = 3;
  wiener_info->vfilter[0] = 3;
  wiener_info->hfilter[1] = -7;
  wiener_info->vfilter[1] = -7;
  wiener_info->hfilter[2] = 0xf;
  wiener_info->vfilter[2] = 0xf;
  wiener_info->hfilter[3] = -0x16;
  wiener_info->vfilter[3] = -0x16;
  wiener_info->hfilter[4] = 0xf;
  wiener_info->vfilter[4] = 0xf;
  wiener_info->hfilter[5] = -7;
  wiener_info->vfilter[5] = -7;
  wiener_info->hfilter[6] = 3;
  wiener_info->vfilter[6] = 3;
  return;
}

Assistant:

static inline void set_default_wiener(WienerInfo *wiener_info) {
  wiener_info->vfilter[0] = wiener_info->hfilter[0] = WIENER_FILT_TAP0_MIDV;
  wiener_info->vfilter[1] = wiener_info->hfilter[1] = WIENER_FILT_TAP1_MIDV;
  wiener_info->vfilter[2] = wiener_info->hfilter[2] = WIENER_FILT_TAP2_MIDV;
  wiener_info->vfilter[WIENER_HALFWIN] = wiener_info->hfilter[WIENER_HALFWIN] =
      -2 *
      (WIENER_FILT_TAP2_MIDV + WIENER_FILT_TAP1_MIDV + WIENER_FILT_TAP0_MIDV);
  wiener_info->vfilter[4] = wiener_info->hfilter[4] = WIENER_FILT_TAP2_MIDV;
  wiener_info->vfilter[5] = wiener_info->hfilter[5] = WIENER_FILT_TAP1_MIDV;
  wiener_info->vfilter[6] = wiener_info->hfilter[6] = WIENER_FILT_TAP0_MIDV;
}